

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O0

void __thiscall duckdb::Linenoise::RefreshSearch(Linenoise *this)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  reference pvVar6;
  char *pcVar7;
  size_t sVar8;
  size_t in_RDI;
  size_t cursor_position;
  size_t history_index;
  value_type search_match;
  Linenoise clone;
  bool oldHighlighting;
  size_t i;
  string highlight_buffer;
  size_t max_render_size;
  size_t search_render_pos;
  size_t search_len;
  char *search_buf;
  bool render_matches;
  size_t total_text_length;
  size_t matches_text_length;
  size_t search_text_length;
  string matches_text;
  string search_text;
  bool no_matches;
  string no_matches_text;
  string search_prompt;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  Linenoise *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  unsigned_long in_stack_fffffffffffffc88;
  allocator *paVar9;
  undefined8 in_stack_fffffffffffffce0;
  string *this_00;
  undefined1 highlight;
  size_t in_stack_fffffffffffffce8;
  char **in_stack_fffffffffffffd08;
  size_t sVar10;
  size_t *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd20;
  searchMatch *in_stack_fffffffffffffd30;
  undefined8 local_2c0;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_290;
  ulong local_218;
  allocator local_209;
  string local_208 [32];
  string local_1e8 [32];
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  char *local_1b0;
  byte local_1a2;
  allocator local_1a1;
  string local_1a0 [32];
  ulong local_180;
  size_t local_178;
  size_t local_170;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [35];
  byte local_5d;
  allocator local_49;
  string local_48 [32];
  string local_28 [40];
  
  highlight = (undefined1)((ulong)in_stack_fffffffffffffce0 >> 0x38);
  ::std::__cxx11::string::string(local_28);
  paVar9 = &local_49;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_48,"(no matches)",paVar9);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  uVar4 = *(ulong *)(in_RDI + 0xa0);
  sVar2 = ::std::vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>::size
                    ((vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_> *)
                     (in_RDI + 0x88));
  local_5d = sVar2 <= uVar4;
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    ::std::__cxx11::string::string(local_e8);
    ::std::__cxx11::string::string(local_108);
    ::std::__cxx11::string::operator+=(local_e8,(string *)(in_RDI + 0x68));
    if ((local_5d & 1) == 0) {
      ::std::__cxx11::to_string(in_stack_fffffffffffffc88);
      ::std::__cxx11::string::operator+=(local_108,local_128);
      ::std::__cxx11::string::~string(local_128);
      ::std::vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>::size
                ((vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_> *)
                 (in_RDI + 0x88));
      ::std::__cxx11::to_string(in_stack_fffffffffffffc88);
      ::std::operator+((char *)in_stack_fffffffffffffc58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      ::std::__cxx11::string::operator+=(local_108,local_148);
      ::std::__cxx11::string::~string(local_148);
      ::std::__cxx11::string::~string(local_168);
    }
    ::std::__cxx11::string::c_str();
    ::std::__cxx11::string::size();
    local_170 = ComputeRenderWidth((char *)CONCAT17(in_stack_fffffffffffffc77,
                                                    in_stack_fffffffffffffc70),
                                   (size_t)in_stack_fffffffffffffc68);
    ::std::__cxx11::string::c_str();
    ::std::__cxx11::string::size();
    local_178 = ComputeRenderWidth((char *)CONCAT17(in_stack_fffffffffffffc77,
                                                    in_stack_fffffffffffffc70),
                                   (size_t)in_stack_fffffffffffffc68);
    local_180 = local_170 + local_178;
    if (local_180 < 0x1a) {
      ::std::__cxx11::string::operator=(local_28,local_e8);
      uVar4 = 0x1a - local_180;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1a0,uVar4,' ',&local_1a1);
      ::std::__cxx11::string::operator+=(local_28,local_1a0);
      ::std::__cxx11::string::~string(local_1a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      ::std::__cxx11::string::operator+=(local_28,local_108);
      ::std::__cxx11::string::operator+=(local_28,"> ");
    }
    else {
      local_1a2 = local_178 < 0x14;
      local_1b0 = (char *)::std::__cxx11::string::c_str();
      local_1b8 = ::std::__cxx11::string::size();
      local_1c0 = 0;
      local_1c8 = 0x19;
      if ((local_1a2 & 1) != 0) {
        local_1c8 = 0x19 - local_178;
      }
      ::std::__cxx11::string::string(local_1e8);
      in_stack_fffffffffffffc50 = 0;
      renderText(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,(size_t *)paVar9,in_RDI,uVar4,
                 in_stack_fffffffffffffce8,in_stack_fffffffffffffd20,(bool)highlight,
                 in_stack_fffffffffffffd30);
      pcVar7 = local_1b0;
      uVar4 = local_1b8;
      paVar9 = &local_209;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_208,pcVar7,uVar4,paVar9);
      ::std::__cxx11::string::operator=(local_28,local_208);
      ::std::__cxx11::string::~string(local_208);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_209);
      for (local_218 = local_1c0; local_218 < local_1c8; local_218 = local_218 + 1) {
        ::std::__cxx11::string::operator+=(local_28," ");
      }
      if ((local_1a2 & 1) != 0) {
        ::std::__cxx11::string::operator+=(local_28,local_108);
      }
      ::std::__cxx11::string::operator+=(local_28,"> ");
      ::std::__cxx11::string::~string(local_1e8);
    }
    ::std::__cxx11::string::~string(local_108);
    ::std::__cxx11::string::~string(local_e8);
  }
  else {
    paVar9 = &local_c1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_c0,0x14,' ',paVar9);
    ::std::operator+((char *)in_stack_fffffffffffffc58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    ::std::operator+(in_stack_fffffffffffffc58,
                     (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    this_00 = local_80;
    ::std::__cxx11::string::operator=(local_28,this_00);
    ::std::__cxx11::string::~string(this_00);
    ::std::__cxx11::string::~string(local_a0);
    ::std::__cxx11::string::~string(local_c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    ::std::__cxx11::string::operator=(local_48,"(type to search)");
  }
  bVar1 = Highlighting::IsEnabled();
  Linenoise((Linenoise *)CONCAT17(bVar1,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68);
  uVar5 = ::std::__cxx11::string::c_str();
  *(undefined8 *)(in_RDI + 0x18) = uVar5;
  uVar5 = ::std::__cxx11::string::size();
  *(undefined8 *)(in_RDI + 0x20) = uVar5;
  if ((local_5d & 1) == 0) {
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pvVar6 = ::std::vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>::operator[]
                         ((vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_> *)
                          (in_RDI + 0x88),*(size_type *)(in_RDI + 0xa0));
      sVar10 = pvVar6->match_end;
      pcVar7 = History::GetEntry(pvVar6->history_index);
      *(char **)(in_RDI + 8) = pcVar7;
      sVar8 = strlen(*(char **)(in_RDI + 8));
      *(size_t *)(in_RDI + 0x38) = sVar8;
      *(size_t *)(in_RDI + 0x28) = sVar10;
      goto LAB_00202037;
    }
  }
  uVar5 = ::std::__cxx11::string::c_str();
  *(undefined8 *)(in_RDI + 8) = uVar5;
  uVar5 = ::std::__cxx11::string::size();
  *(undefined8 *)(in_RDI + 0x38) = uVar5;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  Highlighting::Disable();
LAB_00202037:
  RefreshLine((Linenoise *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  if (bVar1) {
    Highlighting::Enable();
  }
  *(undefined8 *)(in_RDI + 8) = local_2c0;
  *(undefined8 *)(in_RDI + 0x38) = local_290;
  *(undefined8 *)(in_RDI + 0x28) = local_2a0;
  *(undefined8 *)(in_RDI + 0x18) = local_2b0;
  *(undefined8 *)(in_RDI + 0x20) = local_2a8;
  ~Linenoise((Linenoise *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  ::std::__cxx11::string::~string(local_48);
  ::std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Linenoise::RefreshSearch() {
	std::string search_prompt;
	static const size_t SEARCH_PROMPT_RENDER_SIZE = 28;
	std::string no_matches_text = "(no matches)";
	bool no_matches = search_index >= search_matches.size();
	if (search_buf.empty()) {
		search_prompt = "search" + std::string(SEARCH_PROMPT_RENDER_SIZE - 8, ' ') + "> ";
		no_matches_text = "(type to search)";
	} else {
		std::string search_text;
		std::string matches_text;
		search_text += search_buf;
		if (!no_matches) {
			matches_text += std::to_string(search_index + 1);
			matches_text += "/" + std::to_string(search_matches.size());
		}
		size_t search_text_length = ComputeRenderWidth(search_text.c_str(), search_text.size());
		size_t matches_text_length = ComputeRenderWidth(matches_text.c_str(), matches_text.size());
		size_t total_text_length = search_text_length + matches_text_length;
		if (total_text_length < SEARCH_PROMPT_RENDER_SIZE - 2) {
			// search text is short: we can render the entire search text
			search_prompt = search_text;
			search_prompt += std::string(SEARCH_PROMPT_RENDER_SIZE - 2 - total_text_length, ' ');
			search_prompt += matches_text;
			search_prompt += "> ";
		} else {
			// search text length is too long to fit: truncate
			bool render_matches = matches_text_length < SEARCH_PROMPT_RENDER_SIZE - 8;
			char *search_buf = (char *)search_text.c_str();
			size_t search_len = search_text.size();
			size_t search_render_pos = 0;
			size_t max_render_size = SEARCH_PROMPT_RENDER_SIZE - 3;
			if (render_matches) {
				max_render_size -= matches_text_length;
			}
			std::string highlight_buffer;
			renderText(search_render_pos, search_buf, search_len, search_len, max_render_size, 0, highlight_buffer,
			           false);
			search_prompt = std::string(search_buf, search_len);
			for (size_t i = search_render_pos; i < max_render_size; i++) {
				search_prompt += " ";
			}
			if (render_matches) {
				search_prompt += matches_text;
			}
			search_prompt += "> ";
		}
	}
	auto oldHighlighting = Highlighting::IsEnabled();
	Linenoise clone = *this;
	prompt = search_prompt.c_str();
	plen = search_prompt.size();
	if (no_matches || search_buf.empty()) {
		// if there are no matches render the no_matches_text
		buf = (char *)no_matches_text.c_str();
		len = no_matches_text.size();
		pos = 0;
		// don't highlight the "no_matches" text
		Highlighting::Disable();
	} else {
		// if there are matches render the current history item
		auto search_match = search_matches[search_index];
		auto history_index = search_match.history_index;
		auto cursor_position = search_match.match_end;
		buf = (char *)History::GetEntry(history_index);
		len = strlen(buf);
		pos = cursor_position;
	}
	RefreshLine();

	if (oldHighlighting) {
		Highlighting::Enable();
	}
	buf = clone.buf;
	len = clone.len;
	pos = clone.pos;
	prompt = clone.prompt;
	plen = clone.plen;
}